

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3IsRowid(char *z)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "_ROWID_"[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return 1;
  }
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = " WITHOUT ROWID"[lVar3 + 9];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) break;
    }
    else if (""[bVar1] != ""[bVar2]) break;
    lVar3 = lVar3 + 1;
  } while( true );
  if (bVar1 == bVar2) {
    return 1;
  }
  lVar3 = 0;
  do {
    bVar1 = z[lVar3];
    bVar2 = "OID"[lVar3];
    if (bVar1 == bVar2) {
      if ((ulong)bVar1 == 0) goto LAB_0012f6d7;
    }
    else if (""[bVar1] != ""[bVar2]) {
LAB_0012f6d7:
      return (uint)(bVar1 == bVar2);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3IsRowid(const char *z){
  if( sqlite3StrICmp(z, "_ROWID_")==0 ) return 1;
  if( sqlite3StrICmp(z, "ROWID")==0 ) return 1;
  if( sqlite3StrICmp(z, "OID")==0 ) return 1;
  return 0;
}